

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildMarkLine(int nIndex,CNscPStackEntry *pStatement)

{
  if (pStatement == (CNscPStackEntry *)0x0) {
    pStatement = (CNscPStackEntry *)0x0;
  }
  else if (((g_pCtx->m_fPhase2 != false) || (g_pCtx->m_fNWScript == true)) &&
          (pStatement->m_nType != NscType_Error)) {
    CNscPStackEntry::PushLine
              (pStatement,g_pCtx->m_anFileNumbers[nIndex],g_pCtx->m_anLineNumbers[nIndex]);
  }
  return pStatement;
}

Assistant:

YYSTYPE NscBuildMarkLine (int nIndex, YYSTYPE pStatement)
{
	//
	// If the statement is NULL, then do a simple return
	//

	if (pStatement == NULL)
		return NULL;

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		return pStatement;
	}
	
	//
	// Check for silent errors
	//

	if (pStatement ->GetType () == NscType_Error)
	{
	}

	//
	// Otherwise, add the line marker
	//

	else
	{
		pStatement ->PushLine (g_pCtx ->GetFile (nIndex), 
			g_pCtx ->GetLine (nIndex));
	}

	//
	// Return results
	//

	return pStatement;
}